

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

bool __thiscall Glucose::Solver::litRedundant(Solver *this,Lit p,uint32_t abstract_levels)

{
  Lit p_00;
  int iVar1;
  CRef CVar2;
  uint32_t uVar3;
  int iVar4;
  Lit *pLVar5;
  Lit *pLVar6;
  char *pcVar7;
  vec<char> *this_00;
  vec<Glucose::Lit> *this_01;
  uint in_EDX;
  long in_RDI;
  int j;
  Lit p_1;
  int i;
  Lit tmp;
  Clause *c;
  int top;
  Lit *in_stack_ffffffffffffff58;
  Solver *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  vec<char> *in_stack_ffffffffffffff70;
  bool local_61;
  int local_54;
  int local_38;
  lbool local_2d;
  int local_2c;
  lbool local_25;
  int local_24;
  Clause *local_20;
  int local_18;
  uint local_14;
  
  local_14 = in_EDX;
  vec<Glucose::Lit>::clear
            ((vec<Glucose::Lit> *)in_stack_ffffffffffffff60,
             SUB81((ulong)in_stack_ffffffffffffff58 >> 0x38,0));
  vec<Glucose::Lit>::push((vec<Glucose::Lit> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  local_18 = vec<Glucose::Lit>::size((vec<Glucose::Lit> *)(in_RDI + 0x410));
  do {
    iVar1 = vec<Glucose::Lit>::size((vec<Glucose::Lit> *)(in_RDI + 0x400));
    if (iVar1 < 1) {
      return true;
    }
    pLVar5 = vec<Glucose::Lit>::last((vec<Glucose::Lit> *)(in_RDI + 0x400));
    local_24 = pLVar5->x;
    var((Lit)local_24);
    reason(in_stack_ffffffffffffff60,(Var)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    local_20 = ClauseAllocator::operator[]
                         ((ClauseAllocator *)in_stack_ffffffffffffff60,
                          (Ref)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    vec<Glucose::Lit>::pop((vec<Glucose::Lit> *)(in_RDI + 0x400));
    iVar1 = Clause::size(local_20);
    local_61 = false;
    if (iVar1 == 2) {
      pLVar5 = Clause::operator[](local_20,0);
      local_2c = pLVar5->x;
      local_25 = value((Solver *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                       (Lit)(int)in_stack_ffffffffffffff70);
      lbool::lbool(&local_2d,'\x01');
      local_61 = lbool::operator==(&local_25,local_2d);
    }
    if (local_61 != false) {
      pLVar5 = Clause::operator[](local_20,0);
      iVar1 = pLVar5->x;
      pLVar5 = Clause::operator[](local_20,1);
      pLVar6 = Clause::operator[](local_20,0);
      pLVar6->x = pLVar5->x;
      pLVar5 = Clause::operator[](local_20,1);
      pLVar5->x = iVar1;
    }
    for (local_38 = 1; iVar1 = Clause::size(local_20), local_38 < iVar1; local_38 = local_38 + 1) {
      pLVar5 = Clause::operator[](local_20,local_38);
      p_00.x = pLVar5->x;
      iVar1 = var(p_00);
      pcVar7 = vec<char>::operator[]((vec<char> *)(in_RDI + 0x3f0),iVar1);
      if (*pcVar7 == '\0') {
        var(p_00);
        iVar1 = level(in_stack_ffffffffffffff60,(Var)((ulong)in_stack_ffffffffffffff58 >> 0x20));
        if (0 < iVar1) {
          var(p_00);
          CVar2 = reason(in_stack_ffffffffffffff60,(Var)((ulong)in_stack_ffffffffffffff58 >> 0x20));
          if (CVar2 == 0xffffffff) {
LAB_00123dc8:
            local_54 = local_18;
            while (iVar1 = local_54,
                  iVar4 = vec<Glucose::Lit>::size((vec<Glucose::Lit> *)(in_RDI + 0x410)),
                  iVar1 < iVar4) {
              this_00 = (vec<char> *)(in_RDI + 0x3f0);
              pLVar5 = vec<Glucose::Lit>::operator[]((vec<Glucose::Lit> *)(in_RDI + 0x410),local_54)
              ;
              iVar1 = var((Lit)pLVar5->x);
              pcVar7 = vec<char>::operator[](this_00,iVar1);
              *pcVar7 = '\0';
              local_54 = local_54 + 1;
            }
            this_01 = (vec<Glucose::Lit> *)(in_RDI + 0x410);
            iVar1 = vec<Glucose::Lit>::size((vec<Glucose::Lit> *)(in_RDI + 0x410));
            vec<Glucose::Lit>::shrink(this_01,iVar1 - local_18);
            return false;
          }
          var(p_00);
          uVar3 = abstractLevel(in_stack_ffffffffffffff60,
                                (Var)((ulong)in_stack_ffffffffffffff58 >> 0x20));
          if ((uVar3 & local_14) == 0) goto LAB_00123dc8;
          in_stack_ffffffffffffff70 = (vec<char> *)(in_RDI + 0x3f0);
          iVar1 = var(p_00);
          pcVar7 = vec<char>::operator[](in_stack_ffffffffffffff70,iVar1);
          *pcVar7 = '\x01';
          vec<Glucose::Lit>::push
                    ((vec<Glucose::Lit> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
          vec<Glucose::Lit>::push
                    ((vec<Glucose::Lit> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        }
      }
    }
  } while( true );
}

Assistant:

bool Solver::litRedundant(Lit p, uint32_t abstract_levels) {
    analyze_stack.clear();
    analyze_stack.push(p);
    int top = analyze_toclear.size();
    while(analyze_stack.size() > 0) {
        assert(reason(var(analyze_stack.last())) != CRef_Undef);
        Clause &c = ca[reason(var(analyze_stack.last()))];
        analyze_stack.pop(); //
        if(c.size() == 2 && value(c[0]) == l_False) {
            assert(value(c[1]) == l_True);
            Lit tmp = c[0];
            c[0] = c[1], c[1] = tmp;
        }

        for(int i = 1; i < c.size(); i++) {
            Lit p = c[i];
            if(!seen[var(p)]) {
                if(level(var(p)) > 0) {
                    if(reason(var(p)) != CRef_Undef && (abstractLevel(var(p)) & abstract_levels) != 0) {
                        seen[var(p)] = 1;
                        analyze_stack.push(p);
                        analyze_toclear.push(p);
                    } else {
                        for(int j = top; j < analyze_toclear.size(); j++)
                            seen[var(analyze_toclear[j])] = 0;
                        analyze_toclear.shrink(analyze_toclear.size() - top);
                        return false;
                    }
                }
            }
        }
    }

    return true;
}